

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_surjectionproof_generate
              (secp256k1_context *ctx,secp256k1_surjectionproof *proof,
              secp256k1_generator *ephemeral_input_tags,size_t n_ephemeral_input_tags,
              secp256k1_generator *ephemeral_output_tag,size_t input_index,uchar *input_blinding_key
              ,uchar *output_blinding_key)

{
  int iVar1;
  size_t n_input_tags;
  size_t n_pubkeys;
  uchar local_a0f8 [8];
  uchar msg32 [32];
  secp256k1_scalar borromean_s [256];
  secp256k1_gej ring_pubkeys [256];
  size_t ring_input_index;
  size_t n_used_pubkeys;
  size_t n_total_pubkeys;
  size_t i;
  size_t indices [1];
  size_t rsizes [1];
  undefined1 auStack_a0 [4];
  int overflow;
  secp256k1_scalar nonce;
  secp256k1_scalar tmps;
  secp256k1_scalar blinding_key;
  size_t input_index_local;
  secp256k1_generator *ephemeral_output_tag_local;
  size_t n_ephemeral_input_tags_local;
  secp256k1_generator *ephemeral_input_tags_local;
  secp256k1_surjectionproof *proof_local;
  secp256k1_context *ctx_local;
  
  rsizes[0]._4_4_ = 0;
  ring_pubkeys[0xff].infinity = 0;
  ring_pubkeys[0xff]._124_4_ = 0;
  iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)")
    ;
    ctx_local._4_4_ = 0;
  }
  else if (proof == (secp256k1_surjectionproof *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"proof != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (ephemeral_input_tags == (secp256k1_generator *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"ephemeral_input_tags != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (ephemeral_output_tag == (secp256k1_generator *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"ephemeral_output_tag != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (input_blinding_key == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"input_blinding_key != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (output_blinding_key == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"output_blinding_key != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_scalar_set_b32
              ((secp256k1_scalar *)(nonce.d + 3),input_blinding_key,(int *)((long)rsizes + 4));
    if (rsizes[0]._4_4_ == 0) {
      secp256k1_scalar_set_b32
                ((secp256k1_scalar *)(tmps.d + 3),output_blinding_key,(int *)((long)rsizes + 4));
      if (rsizes[0]._4_4_ == 0) {
        iVar1 = secp256k1_scalar_eq((secp256k1_scalar *)(nonce.d + 3),
                                    (secp256k1_scalar *)(tmps.d + 3));
        if ((iVar1 != 0) &&
           (iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)(tmps.d + 3)), iVar1 == 0)) {
          return 0;
        }
        secp256k1_scalar_negate((secp256k1_scalar *)(nonce.d + 3),(secp256k1_scalar *)(nonce.d + 3))
        ;
        secp256k1_scalar_add
                  ((secp256k1_scalar *)(tmps.d + 3),(secp256k1_scalar *)(tmps.d + 3),
                   (secp256k1_scalar *)(nonce.d + 3));
        n_input_tags = secp256k1_surjectionproof_n_total_inputs(ctx,proof);
        n_pubkeys = secp256k1_surjectionproof_n_used_inputs(ctx,proof);
        if ((n_input_tags < n_pubkeys) || (n_input_tags != n_ephemeral_input_tags)) {
          ctx_local._4_4_ = 0;
        }
        else {
          iVar1 = secp256k1_surjection_compute_public_keys
                            ((secp256k1_gej *)(borromean_s[0xff].d + 3),n_pubkeys,
                             ephemeral_input_tags,n_input_tags,proof->used_inputs,
                             ephemeral_output_tag,input_index,(size_t *)&ring_pubkeys[0xff].infinity
                            );
          if (iVar1 == 0) {
            ctx_local._4_4_ = 0;
          }
          else {
            indices[0] = (size_t)(int)n_pubkeys;
            i = (size_t)(int)ring_pubkeys[0xff]._120_8_;
            secp256k1_surjection_genmessage
                      (local_a0f8,ephemeral_input_tags,n_input_tags,ephemeral_output_tag);
            iVar1 = secp256k1_surjection_genrand
                              ((secp256k1_scalar *)(msg32 + 0x18),n_pubkeys,
                               (secp256k1_scalar *)(tmps.d + 3));
            if (iVar1 == 0) {
              ctx_local._4_4_ = 0;
            }
            else {
              _auStack_a0 = borromean_s[ring_pubkeys[0xff]._120_8_ + -1].d[3];
              nonce.d[0] = borromean_s[ring_pubkeys[0xff]._120_8_].d[0];
              nonce.d[1] = borromean_s[ring_pubkeys[0xff]._120_8_].d[1];
              nonce.d[2] = borromean_s[ring_pubkeys[0xff]._120_8_].d[2];
              secp256k1_scalar_clear
                        ((secp256k1_scalar *)(borromean_s[ring_pubkeys[0xff]._120_8_ + -1].d + 3));
              iVar1 = secp256k1_borromean_sign
                                (&ctx->ecmult_gen_ctx,proof->data,(secp256k1_scalar *)(msg32 + 0x18)
                                 ,(secp256k1_gej *)(borromean_s[0xff].d + 3),
                                 (secp256k1_scalar *)auStack_a0,(secp256k1_scalar *)(tmps.d + 3),
                                 indices,&i,1,local_a0f8,0x20);
              if (iVar1 == 0) {
                ctx_local._4_4_ = 0;
              }
              else {
                for (n_total_pubkeys = 0; n_total_pubkeys < n_pubkeys;
                    n_total_pubkeys = n_total_pubkeys + 1) {
                  secp256k1_scalar_get_b32
                            (proof->data + n_total_pubkeys * 0x20 + 0x20,
                             (secp256k1_scalar *)(borromean_s[n_total_pubkeys - 1].d + 3));
                }
                ctx_local._4_4_ = 1;
              }
            }
          }
        }
      }
      else {
        ctx_local._4_4_ = 0;
      }
    }
    else {
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_surjectionproof_generate(const secp256k1_context* ctx, secp256k1_surjectionproof* proof, const secp256k1_generator* ephemeral_input_tags, size_t n_ephemeral_input_tags, const secp256k1_generator* ephemeral_output_tag, size_t input_index, const unsigned char *input_blinding_key, const unsigned char *output_blinding_key) {
    secp256k1_scalar blinding_key;
    secp256k1_scalar tmps;
    secp256k1_scalar nonce;
    int overflow = 0;
    size_t rsizes[1];    /* array needed for borromean sig API */
    size_t indices[1];   /* array needed for borromean sig API */
    size_t i;
    size_t n_total_pubkeys;
    size_t n_used_pubkeys;
    size_t ring_input_index = 0;
    secp256k1_gej ring_pubkeys[SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS];
    secp256k1_scalar borromean_s[SECP256K1_SURJECTIONPROOF_MAX_USED_INPUTS];
    unsigned char msg32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(proof != NULL);
    ARG_CHECK(ephemeral_input_tags != NULL);
    ARG_CHECK(ephemeral_output_tag != NULL);
    ARG_CHECK(input_blinding_key != NULL);
    ARG_CHECK(output_blinding_key != NULL);
#ifdef VERIFY
    CHECK(proof->initialized == 1);
#endif

    /* Compute secret key */
    secp256k1_scalar_set_b32(&tmps, input_blinding_key, &overflow);
    if (overflow) {
        return 0;
    }
    secp256k1_scalar_set_b32(&blinding_key, output_blinding_key, &overflow);
    if (overflow) {
        return 0;
    }
    /* The only time the input may equal the output is if neither one was blinded in the first place,
     * i.e. both blinding keys are zero. Otherwise this is a privacy leak. */
    if (secp256k1_scalar_eq(&tmps, &blinding_key) && !secp256k1_scalar_is_zero(&blinding_key)) {
        return 0;
    }
    secp256k1_scalar_negate(&tmps, &tmps);
    secp256k1_scalar_add(&blinding_key, &blinding_key, &tmps);

    /* Compute public keys */
    n_total_pubkeys = secp256k1_surjectionproof_n_total_inputs(ctx, proof);
    n_used_pubkeys = secp256k1_surjectionproof_n_used_inputs(ctx, proof);
    if (n_used_pubkeys > n_total_pubkeys || n_total_pubkeys != n_ephemeral_input_tags) {
        return 0;
    }

    if (secp256k1_surjection_compute_public_keys(ring_pubkeys, n_used_pubkeys, ephemeral_input_tags, n_total_pubkeys, proof->used_inputs, ephemeral_output_tag, input_index, &ring_input_index) == 0) {
        return 0;
    }

    /* Produce signature */
    rsizes[0] = (int) n_used_pubkeys;
    indices[0] = (int) ring_input_index;
    secp256k1_surjection_genmessage(msg32, ephemeral_input_tags, n_total_pubkeys, ephemeral_output_tag);
    if (secp256k1_surjection_genrand(borromean_s, n_used_pubkeys, &blinding_key) == 0) {
        return 0;
    }
    /* Borromean sign will overwrite one of the s values we just generated, so use
     * it as a nonce instead. This avoids extra random generation and also is an
     * homage to the rangeproof code which does this very cleverly to encode messages. */
    nonce = borromean_s[ring_input_index];
    secp256k1_scalar_clear(&borromean_s[ring_input_index]);
    if (secp256k1_borromean_sign(&ctx->ecmult_gen_ctx, &proof->data[0], borromean_s, ring_pubkeys, &nonce, &blinding_key, rsizes, indices, 1, msg32, 32) == 0) {
        return 0;
    }
    for (i = 0; i < n_used_pubkeys; i++) {
        secp256k1_scalar_get_b32(&proof->data[32 + 32 * i], &borromean_s[i]);
    }
    return 1;
}